

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::ArrayReverseMethod::checkArguments
          (ArrayReverseMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  long lVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount(&this->super_SystemSubroutine,context,true,args,range,0,0)
  ;
  lVar3 = 400;
  if (bVar2) {
    bVar2 = SystemSubroutine::registerLValue(*args->_M_ptr,context);
    lVar3 = (ulong)!bVar2 * 8 + 0x188;
  }
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar3);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (!registerLValue(*args[0], context))
            return comp.getErrorType();

        return comp.getVoidType();
    }